

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_QPDFTokenizer.cc
# Opt level: O1

void __thiscall
Pl_QPDFTokenizer::Pl_QPDFTokenizer
          (Pl_QPDFTokenizer *this,char *identifier,TokenFilter *filter,Pipeline *next)

{
  unique_ptr<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_> *puVar1;
  Members *this_00;
  pointer *__ptr;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_QPDFTokenizer_002ef898;
  this_00 = (Members *)operator_new(0x48);
  *(undefined8 *)((long)&(this_00->buf).super_Pipeline + 0x20) = 0;
  *(Pipeline **)((long)&(this_00->buf).super_Pipeline + 0x28) = (Pipeline *)0x0;
  *(size_type *)((long)&(this_00->buf).super_Pipeline + 0x10) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)&(this_00->buf).super_Pipeline + 0x18))->_M_allocated_capacity = 0;
  (this_00->buf).super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
  (((string *)((long)&(this_00->buf).super_Pipeline + 8))->_M_dataplus)._M_p = (pointer)0x0;
  this_00->filter = (TokenFilter *)0x0;
  (this_00->tokenizer).m._M_t.
  super___uniq_ptr_impl<qpdf::Tokenizer,_std::default_delete<qpdf::Tokenizer>_>._M_t.
  super__Tuple_impl<0UL,_qpdf::Tokenizer_*,_std::default_delete<qpdf::Tokenizer>_>.
  super__Head_base<0UL,_qpdf::Tokenizer_*,_false>._M_head_impl = (Tokenizer *)0x0;
  (this_00->buf).m._M_t.
  super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>._M_t.
  super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
  super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl = (Members *)0x0;
  Members::Members(this_00);
  puVar1 = &this->m;
  (puVar1->_M_t).
  super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>.
  _M_t.
  super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
  .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl = this_00;
  this_00->filter = filter;
  QPDFObjectHandle::TokenFilter::setPipeline(filter,next);
  QPDFTokenizer::allowEOF
            (&((puVar1->_M_t).
               super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
               ._M_t.
               super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
               .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->tokenizer);
  QPDFTokenizer::includeIgnorable
            (&((puVar1->_M_t).
               super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
               ._M_t.
               super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
               .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->tokenizer);
  return;
}

Assistant:

Pl_QPDFTokenizer::Pl_QPDFTokenizer(
    char const* identifier, QPDFObjectHandle::TokenFilter* filter, Pipeline* next) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>())
{
    m->filter = filter;
    QPDFObjectHandle::TokenFilter::PipelineAccessor::setPipeline(m->filter, next);
    m->tokenizer.allowEOF();
    m->tokenizer.includeIgnorable();
}